

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_string_createWithPrefix(sysbvm_context_t *context,char *prefix,sysbvm_tuple_t string)

{
  size_t __n;
  size_t __n_00;
  _Bool *__dest;
  uint8_t *resultData;
  sysbvm_tuple_t result;
  size_t stringSize;
  size_t prefixLen;
  sysbvm_tuple_t string_local;
  char *prefix_local;
  sysbvm_context_t *context_local;
  
  __n = strlen(prefix);
  context_local = (sysbvm_context_t *)string;
  if (__n != 0) {
    __n_00 = sysbvm_tuple_getSizeInBytes(string);
    context_local = (sysbvm_context_t *)sysbvm_string_createEmptyWithSize(context,__n + __n_00);
    __dest = &(context_local->heap).shouldAttemptToCollect;
    memcpy(__dest,prefix,__n);
    memcpy(__dest + __n,(void *)(string + 0x10),__n_00);
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_string_createWithPrefix(sysbvm_context_t *context, const char *prefix, sysbvm_tuple_t string)
{
    size_t prefixLen = strlen(prefix);
    if(prefixLen == 0)
        return string;

    size_t stringSize = sysbvm_tuple_getSizeInBytes(string);
    sysbvm_tuple_t result = sysbvm_string_createEmptyWithSize(context, prefixLen + stringSize);
    uint8_t *resultData = SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(result)->bytes;
    memcpy(resultData, prefix, prefixLen);
    memcpy(resultData + prefixLen, SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(string)->bytes, stringSize);
    return result;
}